

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

void uv__chld(uv_signal_t *handle,int signum)

{
  uint uVar1;
  long *******ppppppplVar2;
  long *******ppppppplVar3;
  long *******ppppppplVar4;
  long *******ppppppplVar5;
  __pid_t _Var6;
  int *piVar7;
  uint uVar8;
  long *******ppppppplVar9;
  void **ppvVar10;
  int status;
  QUEUE pending;
  int local_4c;
  long *******local_48;
  long *******local_40;
  
  if (signum != 0x11) {
    __assert_fail("signum == SIGCHLD",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x3b,"void uv__chld(uv_signal_t *, int)");
  }
  ppppppplVar9 = (long *******)handle->loop->process_handles[0];
  ppvVar10 = handle->loop->process_handles;
  ppppppplVar3 = (long *******)&local_48;
  ppppppplVar4 = (long *******)&local_48;
  ppppppplVar5 = (long *******)&local_48;
  if (ppppppplVar9 != (long *******)ppvVar10) {
    local_48 = (long *******)&local_48;
    local_40 = (long *******)&local_48;
    do {
      ppppppplVar2 = (long *******)*ppppppplVar9;
      do {
        _Var6 = waitpid(*(__pid_t *)(ppppppplVar9 + -1),&local_4c,1);
        if (_Var6 != -1) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      if (_Var6 != 0) {
        if (_Var6 == -1) {
          piVar7 = __errno_location();
          if (*piVar7 != 10) {
            abort();
          }
        }
        else {
          *(int *)(ppppppplVar9 + 2) = local_4c;
          *ppppppplVar9[1] = (long *****)*ppppppplVar9;
          (*ppppppplVar9)[1] = (long *****)ppppppplVar9[1];
          *ppppppplVar9 = (long ******)&local_48;
          ppppppplVar9[1] = (long ******)local_40;
          *local_40 = (long ******)ppppppplVar9;
          local_40 = ppppppplVar9;
        }
      }
      ppppppplVar9 = ppppppplVar2;
      ppppppplVar3 = local_48;
      ppppppplVar4 = local_48;
      ppppppplVar5 = local_40;
    } while (ppppppplVar2 != (long *******)ppvVar10);
  }
  while (ppppppplVar9 = ppppppplVar3, local_48 = ppppppplVar4, local_40 = ppppppplVar5,
        (long ********)ppppppplVar9 != &local_48) {
    ppppppplVar3 = (long *******)*ppppppplVar9;
    *ppppppplVar9[1] = (long *****)ppppppplVar3;
    (*ppppppplVar9)[1] = (long *****)ppppppplVar9[1];
    *ppppppplVar9 = (long ******)ppppppplVar9;
    ppppppplVar9[1] = (long ******)ppppppplVar9;
    uVar1 = *(uint *)(ppppppplVar9 + -3);
    if (((uVar1 >> 0xe & 1) != 0) &&
       (*(uint *)(ppppppplVar9 + -3) = uVar1 & 0xffffbfff, (uVar1 >> 0xd & 1) != 0)) {
      *(int *)(ppppppplVar9[-0xd] + 1) = *(int *)(ppppppplVar9[-0xd] + 1) + -1;
    }
    if (ppppppplVar9[-2] != (long ******)0x0) {
      uVar8 = *(uint *)(ppppppplVar9 + 2) & 0x7f;
      uVar1 = *(uint *)(ppppppplVar9 + 2) >> 8 & 0xff;
      if (uVar8 != 0) {
        uVar1 = 0;
      }
      if ((int)(uVar8 * 0x1000000 + 0x1000000) < 0x2000000) {
        uVar8 = 0;
      }
      (*(code *)ppppppplVar9[-2])(ppppppplVar9 + -0xe,uVar1,uVar8);
      ppppppplVar4 = local_48;
      ppppppplVar5 = local_40;
    }
  }
  if (&local_48 != (long ********)ppppppplVar4) {
    __assert_fail("QUEUE_EMPTY(&pending)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x6f,"void uv__chld(uv_signal_t *, int)");
  }
  return;
}

Assistant:

static void uv__chld(uv_signal_t* handle, int signum) {
  uv_process_t* process;
  uv_loop_t* loop;
  int exit_status;
  int term_signal;
  int status;
  pid_t pid;
  QUEUE pending;
  QUEUE* q;
  QUEUE* h;

  assert(signum == SIGCHLD);

  QUEUE_INIT(&pending);
  loop = handle->loop;

  h = &loop->process_handles;
  q = QUEUE_HEAD(h);
  while (q != h) {
    process = QUEUE_DATA(q, uv_process_t, queue);
    q = QUEUE_NEXT(q);

    do
      pid = waitpid(process->pid, &status, WNOHANG);
    while (pid == -1 && errno == EINTR);

    if (pid == 0)
      continue;

    if (pid == -1) {
      if (errno != ECHILD)
        abort();
      continue;
    }

    process->status = status;
    QUEUE_REMOVE(&process->queue);
    QUEUE_INSERT_TAIL(&pending, &process->queue);
  }

  h = &pending;
  q = QUEUE_HEAD(h);
  while (q != h) {
    process = QUEUE_DATA(q, uv_process_t, queue);
    q = QUEUE_NEXT(q);

    QUEUE_REMOVE(&process->queue);
    QUEUE_INIT(&process->queue);
    uv__handle_stop(process);

    if (process->exit_cb == NULL)
      continue;

    exit_status = 0;
    if (WIFEXITED(process->status))
      exit_status = WEXITSTATUS(process->status);

    term_signal = 0;
    if (WIFSIGNALED(process->status))
      term_signal = WTERMSIG(process->status);

    process->exit_cb(process, exit_status, term_signal);
  }
  assert(QUEUE_EMPTY(&pending));
}